

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

bool QFontDatabase::isBitmapScalable(QString *family,QString *style)

{
  uint uVar1;
  QtFontFoundry *pQVar2;
  char16_t *pcVar3;
  long lVar4;
  QtFontStyle *pQVar5;
  long lVar6;
  uint3 uVar7;
  bool bVar8;
  undefined3 uVar9;
  char cVar10;
  int iVar11;
  Type *pTVar12;
  QtFontFamily *pQVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long in_FS_OFFSET;
  QStringView QVar17;
  QDeadlineTimer QVar18;
  QStringView QVar19;
  bool local_a8;
  QString local_78;
  QString local_58;
  Key local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  parseFontName(family,&local_78,&local_58);
  pTVar12 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                        *)family);
  if (pTVar12 != (Type *)0x0) {
    QVar18.t2 = 0xffffffff;
    QVar18.type = 0x7fffffff;
    QVar18.t1 = (qint64)pTVar12;
    QRecursiveMutex::tryLock(QVar18);
  }
  QFontDatabasePrivate::ensureFontDatabase();
  pQVar13 = QFontDatabasePrivate::family
                      (&QFontDatabasePrivate::instance::instance,&local_58,EnsurePopulated);
  if (pQVar13 != (QtFontFamily *)0x0) {
    local_3c = (Key)0xaaaaaaaa;
    QtFontStyle::Key::Key(&local_3c,style);
    if (0 < pQVar13->count) {
      lVar14 = 0;
      local_a8 = false;
      do {
        pQVar2 = pQVar13->foundries[lVar14];
        if (local_78.d.size == 0) {
LAB_0025bfd7:
          iVar11 = pQVar2->count;
          bVar8 = true;
          if (0 < (long)iVar11) {
            pcVar3 = (style->d).ptr;
            lVar4 = (style->d).size;
            uVar9 = local_3c._0_3_;
            uVar16 = (uint)local_3c & 0xffffff;
            lVar15 = 0;
            do {
              if (lVar4 == 0) {
LAB_0025c087:
                uVar1 = *(uint *)&pQVar2->styles[lVar15]->field_0x4;
                if (((uVar1 & 2) == 0 & (byte)uVar1) != 0) {
                  local_a8 = true;
                  bVar8 = false;
                  goto LAB_0025c0c6;
                }
              }
              else {
                pQVar5 = pQVar2->styles[lVar15];
                lVar6 = (pQVar5->styleName).d.size;
                if ((lVar6 == lVar4) &&
                   (QVar17.m_data = pcVar3, QVar17.m_size = lVar4,
                   QVar19.m_data = (pQVar5->styleName).d.ptr, QVar19.m_size = lVar6,
                   cVar10 = QtPrivate::equalStrings(QVar19,QVar17), cVar10 != '\0'))
                goto LAB_0025c087;
                uVar7 = uVar9 ^ *(uint3 *)&pQVar5->key;
                if (((uVar7 & 0xfff) == 0) &&
                   ((*(uint3 *)&pQVar5->key < 0x1000 || uVar16 < 0x1000) || uVar7 < 0x1000))
                goto LAB_0025c087;
              }
              lVar15 = lVar15 + 1;
            } while (iVar11 != lVar15);
            bVar8 = true;
          }
        }
        else {
          iVar11 = QString::compare(&pQVar2->name,(CaseSensitivity)&local_78);
          bVar8 = true;
          if (iVar11 == 0) goto LAB_0025bfd7;
        }
LAB_0025c0c6:
      } while ((bVar8) && (lVar14 = lVar14 + 1, lVar14 < pQVar13->count));
      goto LAB_0025c0e8;
    }
  }
  local_a8 = false;
LAB_0025c0e8:
  if (pTVar12 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_a8;
}

Assistant:

bool QFontDatabase::isBitmapScalable(const QString &family,
                                      const QString &style)
{
    bool bitmapScalable = false;
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QtFontFamily *f = d->family(familyName);
    if (!f) return bitmapScalable;

    QtFontStyle::Key styleKey(style);
    for (int j = 0; j < f->count; j++) {
        QtFontFoundry *foundry = f->foundries[j];
        if (foundryName.isEmpty() || foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            for (int k = 0; k < foundry->count; k++)
                if ((style.isEmpty() ||
                     foundry->styles[k]->styleName == style ||
                     foundry->styles[k]->key == styleKey)
                    && foundry->styles[k]->bitmapScalable && !foundry->styles[k]->smoothScalable) {
                    bitmapScalable = true;
                    goto end;
                }
        }
    }
 end:
    return bitmapScalable;
}